

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_event_thread.c
# Opt level: O1

void ares_event_thread_destroy(ares_channel_t *channel)

{
  if ((ares_event_thread_t *)channel->sock_state_cb_data != (ares_event_thread_t *)0x0) {
    ares_event_thread_destroy_int((ares_event_thread_t *)channel->sock_state_cb_data);
    channel->sock_state_cb = (ares_sock_state_cb)0x0;
    channel->sock_state_cb_data = (void *)0x0;
    channel->notify_pending_write_cb = (ares_pending_write_cb)0x0;
    channel->notify_pending_write_cb_data = (void *)0x0;
  }
  return;
}

Assistant:

void ares_event_thread_destroy(ares_channel_t *channel)
{
  ares_event_thread_t *e = channel->sock_state_cb_data;

  if (e == NULL) {
    return; /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  ares_event_thread_destroy_int(e);
  channel->sock_state_cb_data           = NULL;
  channel->sock_state_cb                = NULL;
  channel->notify_pending_write_cb      = NULL;
  channel->notify_pending_write_cb_data = NULL;
}